

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate_suite.cpp
# Opt level: O0

void accumulate_array_boolean(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_1c8;
  undefined1 local_1be;
  undefined1 local_1bd [2];
  undefined1 local_1bb;
  undefined1 local_1ba [2];
  basic_variable<std::allocator<char>_> local_1b8;
  iterator local_188;
  iterator local_170;
  undefined1 local_158 [8];
  variable result;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_108,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_d8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_78,true);
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_1c8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_1c8 = local_1c8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1c8);
  } while (local_1c8 != &local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_170,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_188,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1b8);
  std::
  accumulate<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            ((basic_variable<std::allocator<char>_> *)local_158,&local_170,&local_188,&local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_170);
  local_1ba[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_158);
  local_1bb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("result.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/accumulate_suite.cpp"
             ,0x6f,"void accumulate_array_boolean()",local_1ba,&local_1bb);
  local_1bd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                           ((basic_variable<std::allocator<char>_> *)local_158);
  local_1be = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("result.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/accumulate_suite.cpp"
             ,0x70,"void accumulate_array_boolean()",local_1bd,&local_1be);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void accumulate_array_boolean()
{
    variable data = array::make({ false, false, true, true });
    variable result = std::accumulate(data.begin(), data.end(), variable());
    TRIAL_PROTOCOL_TEST_EQUAL(result.is<bool>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(result.value<bool>(), true);
}